

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseContentEncodingEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader)

{
  long lVar1;
  ContentCompression **ppCVar2;
  ContentEncryption **ppCVar3;
  ContentEncryption *encryption;
  unsigned_long_long uVar4;
  longlong lVar5;
  uint uVar6;
  ContentEncoding *pCVar7;
  uint uVar8;
  longlong lVar9;
  long stop;
  longlong pos;
  longlong size_1;
  IMkvReader *local_50;
  ContentEncoding *local_48;
  long local_40;
  longlong id;
  
  local_50 = pReader;
  local_48 = this;
  if (pReader == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x106b,
                  "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                 );
  }
  stop = size + start;
  uVar8 = 0;
  uVar6 = 0;
  pos = start;
  local_40 = start;
  while (pCVar7 = local_48, pos < stop) {
    lVar1 = ParseElementHeader(local_50,&pos,stop,&id,&size_1);
    if (lVar1 < 0) {
      return lVar1;
    }
    uVar6 = uVar6 + (id == 0x5034);
    uVar8 = uVar8 + (id == 0x5035);
    pos = pos + size_1;
    if (stop < pos) {
      return -2;
    }
  }
  if (uVar6 == 0 && uVar8 == 0) {
    return -1;
  }
  if (uVar6 != 0) {
    ppCVar2 = (ContentCompression **)operator_new__((ulong)uVar6 << 3,(nothrow_t *)&std::nothrow);
    pCVar7->compression_entries_ = ppCVar2;
    if (ppCVar2 == (ContentCompression **)0x0) {
      return -1;
    }
    pCVar7->compression_entries_end_ = ppCVar2;
  }
  lVar1 = local_40;
  if (uVar8 != 0) {
    ppCVar3 = (ContentEncryption **)operator_new__((ulong)uVar8 << 3,(nothrow_t *)&std::nothrow);
    pCVar7->encryption_entries_ = ppCVar3;
    if (ppCVar3 == (ContentEncryption **)0x0) {
      if (pCVar7->compression_entries_ != (ContentCompression **)0x0) {
        operator_delete__(pCVar7->compression_entries_);
      }
      pCVar7->compression_entries_ = (ContentCompression **)0x0;
      return -1;
    }
    pCVar7->encryption_entries_end_ = ppCVar3;
    lVar1 = local_40;
  }
  do {
    if (stop <= lVar1) {
      return (ulong)(lVar1 == stop) * 2 + -2;
    }
    pos = lVar1;
    lVar1 = ParseElementHeader(local_50,&pos,stop,&id,&size_1);
    lVar9 = size_1;
    lVar5 = pos;
    if (lVar1 < 0) {
      return lVar1;
    }
    switch(id) {
    case 0x5031:
      uVar4 = UnserializeUInt(local_50,pos,size_1);
      local_48->encoding_order_ = uVar4;
      break;
    case 0x5032:
      uVar4 = UnserializeUInt(local_50,pos,size_1);
      local_48->encoding_scope_ = uVar4;
      if (uVar4 == 0) {
        return -1;
      }
      break;
    case 0x5033:
      uVar4 = UnserializeUInt(local_50,pos,size_1);
      local_48->encoding_type_ = uVar4;
      break;
    case 0x5034:
      pCVar7 = (ContentEncoding *)0x18;
      encryption = (ContentEncryption *)operator_new(0x18,(nothrow_t *)&std::nothrow);
      lVar9 = size_1;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->key_id_len = 0;
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      local_40 = pos;
      lVar1 = ParseCompressionEntry(pCVar7,pos,size_1,local_50,(ContentCompression *)encryption);
      if (lVar1 != 0) {
        ContentCompression::~ContentCompression((ContentCompression *)encryption);
LAB_00111115:
        operator_delete(encryption);
        return lVar1;
      }
      if (uVar6 == 0) {
        __assert_fail("compression_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10b5,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = (ContentEncryption **)local_48->compression_entries_end_;
      local_48->compression_entries_end_ = (ContentCompression **)(ppCVar3 + 1);
      goto LAB_00111071;
    case 0x5035:
      pCVar7 = (ContentEncoding *)0x50;
      encryption = (ContentEncryption *)operator_new(0x50,(nothrow_t *)&std::nothrow);
      lVar9 = size_1;
      if (encryption == (ContentEncryption *)0x0) {
        return -1;
      }
      encryption->sig_key_id_len = 0;
      encryption->sig_algo = 0;
      encryption->signature_len = 0;
      encryption->sig_key_id = (uchar *)0x0;
      encryption->key_id_len = 0;
      encryption->signature = (uchar *)0x0;
      encryption->sig_hash_algo = 0;
      encryption->algo = 0;
      encryption->key_id = (uchar *)0x0;
      (encryption->aes_settings).cipher_mode = 1;
      local_40 = pos;
      lVar1 = ParseEncryptionEntry(pCVar7,pos,size_1,local_50,encryption);
      if (lVar1 != 0) {
        ContentEncryption::~ContentEncryption(encryption);
        goto LAB_00111115;
      }
      if (uVar8 == 0) {
        __assert_fail("encryption_count > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x10c2,
                      "long mkvparser::ContentEncoding::ParseContentEncodingEntry(long long, long long, IMkvReader *)"
                     );
      }
      ppCVar3 = local_48->encryption_entries_end_;
      local_48->encryption_entries_end_ = ppCVar3 + 1;
LAB_00111071:
      *ppCVar3 = encryption;
      lVar5 = local_40;
    }
    lVar1 = lVar5 + lVar9;
    if (stop < lVar5 + lVar9) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseContentEncodingEntry(long long start, long long size,
                                                IMkvReader* pReader) {
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentCompression and ContentEncryption elements.
  int compression_count = 0;
  int encryption_count = 0;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompression)
      ++compression_count;

    if (id == libwebm::kMkvContentEncryption)
      ++encryption_count;

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (compression_count <= 0 && encryption_count <= 0)
    return -1;

  if (compression_count > 0) {
    compression_entries_ =
        new (std::nothrow) ContentCompression*[compression_count];
    if (!compression_entries_)
      return -1;
    compression_entries_end_ = compression_entries_;
  }

  if (encryption_count > 0) {
    encryption_entries_ =
        new (std::nothrow) ContentEncryption*[encryption_count];
    if (!encryption_entries_) {
      delete[] compression_entries_;
      compression_entries_ = NULL;
      return -1;
    }
    encryption_entries_end_ = encryption_entries_;
  }

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentEncodingOrder) {
      encoding_order_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentEncodingScope) {
      encoding_scope_ = UnserializeUInt(pReader, pos, size);
      if (encoding_scope_ < 1)
        return -1;
    } else if (id == libwebm::kMkvContentEncodingType) {
      encoding_type_ = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvContentCompression) {
      ContentCompression* const compression =
          new (std::nothrow) ContentCompression();
      if (!compression)
        return -1;

      status = ParseCompressionEntry(pos, size, pReader, compression);
      if (status) {
        delete compression;
        return status;
      }
      assert(compression_count > 0);
      *compression_entries_end_++ = compression;
    } else if (id == libwebm::kMkvContentEncryption) {
      ContentEncryption* const encryption =
          new (std::nothrow) ContentEncryption();
      if (!encryption)
        return -1;

      status = ParseEncryptionEntry(pos, size, pReader, encryption);
      if (status) {
        delete encryption;
        return status;
      }
      assert(encryption_count > 0);
      *encryption_entries_end_++ = encryption;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}